

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
cnn::Pow::dim_forward
          (Dim *__return_storage_ptr__,Pow *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  invalid_argument *this_00;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  Dim r;
  string asStack_1b8 [32];
  undefined8 local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined8 uStack_184;
  uint local_17c;
  undefined4 local_178;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar1 != 0x48) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes-common.cc"
                  ,0x307,"virtual Dim cnn::Pow::dim_forward(const vector<Dim> &) const");
  }
  __return_storage_ptr__->bd = pDVar1->bd;
  uVar2 = *(undefined8 *)pDVar1->d;
  uVar3 = *(undefined8 *)(pDVar1->d + 2);
  uVar4 = *(undefined8 *)(pDVar1->d + 6);
  *(undefined8 *)(__return_storage_ptr__->d + 4) = *(undefined8 *)(pDVar1->d + 4);
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar4;
  *(undefined8 *)__return_storage_ptr__->d = uVar2;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar3;
  uVar5 = (ulong)pDVar1->nd;
  uVar8 = 1;
  iVar6 = 1;
  if (uVar5 != 0) {
    uVar9 = 0;
    do {
      iVar6 = iVar6 * pDVar1->d[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  uVar7 = iVar6 * pDVar1->bd;
  if (1 < uVar7) {
    uVar9 = 1;
    uVar10 = 1;
    do {
      if (uVar10 < uVar5) {
        bVar11 = 1 < pDVar1->d[uVar10];
      }
      else {
        bVar11 = false;
      }
      uVar10 = uVar10 + 1;
      if (bVar11) {
        uVar9 = uVar10 & 0xffffffff;
      }
      uVar8 = (uint)uVar9;
    } while (uVar7 != uVar10);
  }
  __return_storage_ptr__->nd = uVar8;
  uVar5 = (ulong)pDVar1[1].nd;
  local_17c = 1;
  iVar6 = 1;
  if (uVar5 != 0) {
    uVar9 = 0;
    do {
      iVar6 = iVar6 * pDVar1[1].d[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  uVar8 = iVar6 * pDVar1[1].bd;
  if (1 < uVar8) {
    local_17c = 1;
    uVar9 = 0;
    do {
      uVar10 = uVar9 + 1;
      if (uVar10 < uVar5) {
        bVar11 = 1 < pDVar1[1].d[uVar9 + 1];
      }
      else {
        bVar11 = false;
      }
      if (bVar11) {
        local_17c = (int)uVar9 + 2;
      }
      uVar9 = uVar10;
    } while ((ulong)uVar8 - 1 != uVar10);
  }
  uStack_188 = (undefined4)((ulong)*(undefined8 *)(pDVar1[1].d + 3) >> 0x20);
  uStack_184 = *(undefined8 *)(pDVar1[1].d + 5);
  local_198 = *(undefined8 *)pDVar1[1].d;
  uStack_190 = (undefined4)*(undefined8 *)(pDVar1[1].d + 2);
  uStack_18c = (undefined4)((ulong)*(undefined8 *)(pDVar1[1].d + 2) >> 0x20);
  local_178 = 1;
  if (local_17c != 0) {
    iVar6 = 1;
    uVar5 = 0;
    do {
      iVar6 = iVar6 * *(int *)((long)&local_198 + uVar5 * 4);
      uVar5 = uVar5 + 1;
    } while (local_17c != uVar5);
    if (iVar6 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_198,"Bad input dimensions in Pow: ",0x1d);
      operator<<((ostream *)&local_198,xs);
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(this_00,asStack_1b8);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string LogisticSigmoid::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "\\sigma(" << arg_names[0] << ')';
  return s.str();
}